

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::link_program(NegativeTestContext *ctx)

{
  RenderContext *renderCtx;
  GLuint program_00;
  GLuint program_01;
  allocator<char> local_20a;
  allocator<char> local_209;
  deUint32 buf;
  deUint32 tfID;
  ShaderProgram program;
  char *tfVarying;
  
  program_00 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  program_01 = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
  glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,program_01);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program,
             "GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.",
             (allocator<char> *)&tfVarying);
  NegativeTestContext::beginSection(ctx,(string *)&program);
  std::__cxx11::string::~string((string *)&program);
  glu::CallLogWrapper::glLinkProgram(&ctx->super_CallLogWrapper,program_01);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program,
             "GL_INVALID_OPERATION is generated if program is not a program object.",
             (allocator<char> *)&tfVarying);
  NegativeTestContext::beginSection(ctx,(string *)&program);
  std::__cxx11::string::~string((string *)&program);
  glu::CallLogWrapper::glLinkProgram(&ctx->super_CallLogWrapper,program_00);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,program_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program,
             "GL_INVALID_OPERATION is generated if program is the currently active program object and transform feedback mode is active."
             ,(allocator<char> *)&tfVarying);
  NegativeTestContext::beginSection(ctx,(string *)&program);
  std::__cxx11::string::~string((string *)&program);
  renderCtx = ctx->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"#version 300 es\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n",
             &local_209);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tfID,
             "#version 300 es\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = vec4(0.0);\n}\n"
             ,&local_20a);
  glu::makeVtxFragSources((ProgramSources *)&tfVarying,(string *)&buf,(string *)&tfID);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)&tfVarying);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&tfVarying);
  std::__cxx11::string::~string((string *)&tfID);
  std::__cxx11::string::~string((string *)&buf);
  buf = 0x1234;
  tfID = 0x1234;
  tfVarying = "gl_Position";
  glu::CallLogWrapper::glGenTransformFeedbacks(&ctx->super_CallLogWrapper,1,&tfID);
  glu::CallLogWrapper::glGenBuffers(&ctx->super_CallLogWrapper,1,&buf);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
  glu::CallLogWrapper::glTransformFeedbackVaryings
            (&ctx->super_CallLogWrapper,program.m_program.m_program,1,&tfVarying,0x8c8c);
  glu::CallLogWrapper::glLinkProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
  glu::CallLogWrapper::glBindTransformFeedback(&ctx->super_CallLogWrapper,0x8e22,tfID);
  glu::CallLogWrapper::glBindBuffer(&ctx->super_CallLogWrapper,0x8c8e,buf);
  glu::CallLogWrapper::glBufferData(&ctx->super_CallLogWrapper,0x8c8e,0x20,(void *)0x0,0x88e8);
  glu::CallLogWrapper::glBindBufferBase(&ctx->super_CallLogWrapper,0x8c8e,0,buf);
  glu::CallLogWrapper::glBeginTransformFeedback(&ctx->super_CallLogWrapper,4);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glLinkProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glEndTransformFeedback(&ctx->super_CallLogWrapper);
  glu::CallLogWrapper::glDeleteTransformFeedbacks(&ctx->super_CallLogWrapper,1,&tfID);
  glu::CallLogWrapper::glDeleteBuffers(&ctx->super_CallLogWrapper,1,&buf);
  NegativeTestContext::expectError(ctx,0);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram(&program);
  return;
}

Assistant:

void link_program (NegativeTestContext& ctx)
{
	GLuint shader = ctx.glCreateShader(GL_VERTEX_SHADER);

	const GLuint notAProgram = ctx.glCreateProgram();
	ctx.glDeleteProgram(notAProgram);

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.");
	ctx.glLinkProgram(notAProgram);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is not a program object.");
	ctx.glLinkProgram(shader);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteShader(shader);

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is the currently active program object and transform feedback mode is active.");
	glu::ShaderProgram			program(ctx.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource));
	deUint32					buf = 0x1234;
	deUint32					tfID = 0x1234;
	const char* tfVarying		= "gl_Position";

	ctx.glGenTransformFeedbacks		(1, &tfID);
	ctx.glGenBuffers				(1, &buf);

	ctx.glUseProgram				(program.getProgram());
	ctx.glTransformFeedbackVaryings	(program.getProgram(), 1, &tfVarying, GL_INTERLEAVED_ATTRIBS);
	ctx.glLinkProgram				(program.getProgram());
	ctx.glBindTransformFeedback		(GL_TRANSFORM_FEEDBACK, tfID);
	ctx.glBindBuffer				(GL_TRANSFORM_FEEDBACK_BUFFER, buf);
	ctx.glBufferData				(GL_TRANSFORM_FEEDBACK_BUFFER, 32, DE_NULL, GL_DYNAMIC_DRAW);
	ctx.glBindBufferBase			(GL_TRANSFORM_FEEDBACK_BUFFER, 0, buf);
	ctx.glBeginTransformFeedback	(GL_TRIANGLES);
	ctx.expectError					(GL_NO_ERROR);

	ctx.glLinkProgram				(program.getProgram());
	ctx.expectError				(GL_INVALID_OPERATION);

	ctx.glEndTransformFeedback		();
	ctx.glDeleteTransformFeedbacks	(1, &tfID);
	ctx.glDeleteBuffers				(1, &buf);
	ctx.expectError				(GL_NO_ERROR);
	ctx.endSection();
}